

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

void __thiscall
absl::debugging_internal::ElfMemImage::SymbolIterator::Update(SymbolIterator *this,int increment)

{
  ElfMemImage *this_00;
  Elf64_Word EVar1;
  Elf64_Ehdr *pEVar2;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar3;
  char *pcVar4;
  Elf64_Verdef *pEVar5;
  void *pvVar6;
  int index;
  char *pcVar7;
  
  this_00 = (ElfMemImage *)this->image_;
  pEVar2 = this_00->ehdr_;
  if (increment != 0 && pEVar2 == (Elf64_Ehdr *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x155,"Check %s failed: %s",
               "image->IsPresent() || increment == 0","");
    pEVar2 = this_00->ehdr_;
  }
  if (pEVar2 == (Elf64_Ehdr *)0x0) {
    return;
  }
  index = increment + this->index_;
  this->index_ = index;
  if (this_00->hash_ == (Elf64_Word *)0x0) {
    EVar1 = 0;
    if (-1 < index) goto LAB_0013f114;
  }
  else {
    EVar1 = this_00->hash_[1];
    if ((int)EVar1 <= index) {
LAB_0013f114:
      this->index_ = EVar1;
      return;
    }
  }
  sym = GetDynsym(this_00,index);
  pEVar3 = GetVersym(this_00,this->index_);
  if ((sym == (Elf64_Sym *)0x0) || (pEVar3 == (Elf64_Versym *)0x0)) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x160,"Check %s failed: %s","symbol && version_symbol","");
  }
  pcVar4 = GetDynstr(this_00,sym->st_name);
  pcVar7 = "";
  if ((sym->st_shndx != 0) &&
     (pEVar5 = GetVerdef(this_00,*pEVar3 & 0x7fff), pEVar5 != (Elf64_Verdef *)0x0)) {
    if ((ushort)(pEVar5->vd_cnt - 3) < 0xfffe) {
      raw_logging_internal::RawLog
                (kFatal,"elf_mem_image.cc",0x175,"Check %s failed: %s",
                 "version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2",
                 "wrong number of entries");
    }
    EVar1._0_2_ = pEVar5[1].vd_version;
    EVar1._2_2_ = pEVar5[1].vd_flags;
    pcVar7 = GetVerstr(this_00,EVar1);
  }
  (this->info_).name = pcVar4;
  (this->info_).version = pcVar7;
  pvVar6 = GetSymAddr(this_00,sym);
  (this->info_).address = pvVar6;
  (this->info_).symbol = sym;
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(int increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}